

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_pecho(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  CHAR_DATA *pCVar4;
  CHAR_DATA *victim;
  char arg [4608];
  char buffer [9216];
  undefined4 in_stack_ffffffffffffc9d8;
  undefined4 in_stack_ffffffffffffc9dc;
  char *in_stack_ffffffffffffc9e0;
  char in_stack_ffffffffffffc9e8;
  undefined7 in_stack_ffffffffffffc9e9;
  CHAR_DATA *in_stack_ffffffffffffc9f0;
  char *in_stack_ffffffffffffc9f8;
  char *in_stack_ffffffffffffca00;
  char *in_stack_ffffffffffffede0;
  CHAR_DATA *in_stack_ffffffffffffede8;
  
  pcVar3 = one_argument(in_stack_ffffffffffffc9e0,
                        (char *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
  if ((*pcVar3 == '\0') || (in_stack_ffffffffffffc9e8 == '\0')) {
    send_to_char((char *)in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
  }
  else {
    pCVar4 = get_char_world(in_stack_ffffffffffffede8,in_stack_ffffffffffffede0);
    if (pCVar4 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffc9f0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    }
    else {
      iVar1 = get_trust((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
      iVar2 = get_trust((CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffc9d8));
      if (iVar2 <= iVar1) {
        iVar1 = get_trust((CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffc9d8));
        if (iVar1 != 0x3c) {
          send_to_char((char *)in_stack_ffffffffffffc9f0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
        }
      }
      colorconv(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8,in_stack_ffffffffffffc9f0);
      send_to_char((char *)in_stack_ffffffffffffc9f0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
      send_to_char((char *)in_stack_ffffffffffffc9f0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
      colorconv(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8,in_stack_ffffffffffffc9f0);
      send_to_char((char *)in_stack_ffffffffffffc9f0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
      send_to_char((char *)in_stack_ffffffffffffc9f0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
      send_to_char((char *)in_stack_ffffffffffffc9f0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    }
  }
  return;
}

Assistant:

void do_pecho(CHAR_DATA *ch, char *argument)
{
	char buffer[MAX_STRING_LENGTH * 2];
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, arg);

	if (argument[0] == '\0' || arg[0] == '\0')
	{
		send_to_char("Personal echo what?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("Target not found.\n\r", ch);
		return;
	}

	if (get_trust(victim) >= get_trust(ch) && get_trust(ch) != MAX_LEVEL)
		send_to_char("personal> ", victim);

	colorconv(buffer, argument, victim);
	send_to_char(buffer, victim);
	send_to_char("\n\r", victim);

	colorconv(buffer, argument, ch);
	send_to_char("personal> ", ch);
	send_to_char(buffer, ch);
	send_to_char("\n\r", ch);
}